

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void PrintJSONString(string *in)

{
  void *__ptr;
  size_t __n;
  undefined1 local_30 [8];
  string out;
  string *in_local;
  
  out.field_2._8_8_ = in;
  EncodeJSONString((string *)local_30,in);
  __ptr = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::length();
  fwrite(__ptr,1,__n,_stdout);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void PrintJSONString(const std::string& in) {
  std::string out = EncodeJSONString(in);
  fwrite(out.c_str(), 1, out.length(), stdout);
}